

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item.hpp
# Opt level: O0

item * __thiscall libtorrent::dht::item::operator=(item *this,item *param_1)

{
  item *param_1_local;
  item *this_local;
  
  entry::operator=(&this->m_value,&param_1->m_value);
  ::std::__cxx11::string::operator=((string *)&this->m_salt,(string *)&param_1->m_salt);
  memcpy(&this->m_pk,&param_1->m_pk,0x60);
  sequence_number::operator=(&this->m_seq,(sequence_number)(param_1->m_seq).value);
  this->m_mutable = (bool)(param_1->m_mutable & 1);
  return this;
}

Assistant:

class TORRENT_EXTRA_EXPORT item
{
public:
	item() {}
	item(public_key const& pk, span<char const> salt);
	explicit item(entry v);
	item(entry v
		, span<char const> salt
		, sequence_number seq
		, public_key const& pk
		, secret_key const& sk);
	explicit item(bdecode_node const& v);

	void assign(entry v);
	void assign(entry v, span<char const> salt
		, sequence_number seq
		, public_key const& pk
		, secret_key const& sk);
	void assign(bdecode_node const& v);
	bool assign(bdecode_node const& v, span<char const> salt
		, sequence_number seq
		, public_key const& pk
		, signature const& sig);
	void assign(entry v, span<char const> salt
		, sequence_number seq
		, public_key const& pk
		, signature const& sig);

	void clear() { m_value = entry(); }
	bool empty() const { return m_value.type() == entry::undefined_t; }

	bool is_mutable() const { return m_mutable; }

	entry const& value() const { return m_value; }
	public_key const& pk() const
	{ return m_pk; }
	signature const& sig() const
	{ return m_sig; }
	sequence_number seq() const { return m_seq; }
	std::string const& salt() const { return m_salt; }

private:
	entry m_value;
	std::string m_salt;
	public_key m_pk;
	signature m_sig;
	sequence_number m_seq{0};
	bool m_mutable = false;
}